

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O3

Group * __thiscall adios2::core::Group::InquireGroup(Group *this,string *groupName)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int iVar4;
  long *plVar5;
  Group *pGVar6;
  __string_type __str;
  Group *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  undefined1 local_68 [24];
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40 [16];
  
  iVar4 = std::__cxx11::string::compare((char *)this);
  if (iVar4 != 0) {
    pcVar1 = (this->currentPath)._M_dataplus._M_p;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + (this->currentPath)._M_string_length);
    std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_48,0,'\x01');
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_50,(ulong)(groupName->_M_dataplus)._M_p);
    pGVar6 = (Group *)(plVar5 + 2);
    if ((Group *)*plVar5 == pGVar6) {
      local_68._0_8_ = (pGVar6->currentPath)._M_dataplus._M_p;
      local_68._8_8_ = plVar5[3];
      local_78 = (Group *)local_68;
    }
    else {
      local_68._0_8_ = (pGVar6->currentPath)._M_dataplus._M_p;
      local_78 = (Group *)*plVar5;
    }
    _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar5[1];
    *plVar5 = (long)pGVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)groupName,(string *)&local_78);
    if (local_78 != (Group *)local_68) {
      operator_delete(local_78);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  local_78 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<adios2::core::Group,std::allocator<adios2::core::Group>,std::__cxx11::string&,char&,adios2::core::IO&>
            (&_Stack_70,&local_78,(allocator<adios2::core::Group> *)&local_50,groupName,
             &this->groupDelimiter,this->m_IO);
  _Var3._M_pi = _Stack_70._M_pi;
  pGVar6 = local_78;
  local_78 = (Group *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->m_Gr).super___shared_ptr<adios2::core::Group,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->m_Gr).super___shared_ptr<adios2::core::Group,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pGVar6;
  (this->m_Gr).super___shared_ptr<adios2::core::Group,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var3._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
    }
  }
  peVar2 = (this->m_Gr).super___shared_ptr<adios2::core::Group,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar2->mapPtr).super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (this->mapPtr).
           super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar2->mapPtr).
              super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(this->mapPtr).
              super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return (this->m_Gr).super___shared_ptr<adios2::core::Group,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
}

Assistant:

Group *Group::InquireGroup(std::string groupName)
{
    if (currentPath.compare("") != 0)
    {
        groupName = currentPath + groupDelimiter + groupName;
    }
    m_Gr = std::make_shared<Group>(groupName, this->groupDelimiter, this->m_IO);
    m_Gr->mapPtr = this->mapPtr;
    return m_Gr.get();
}